

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseComment(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  commentSAXFunc UNRECOVERED_JUMPTABLE;
  xmlParserInputPtr pxVar2;
  int iVar3;
  uint uVar4;
  xmlChar *pxVar5;
  xmlChar xVar6;
  long lVar7;
  long lVar8;
  size_t len;
  xmlChar *pxVar9;
  ulong __n;
  char *msg;
  xmlChar *pxVar10;
  ulong local_40;
  
  lVar7 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    lVar7 = 10000000;
  }
  pxVar2 = ctxt->input;
  pxVar9 = pxVar2->cur;
  if ((*pxVar9 == '<') && (pxVar9[1] == '!')) {
    pxVar5 = pxVar9 + 2;
    pxVar2->cur = pxVar5;
    pxVar2->col = pxVar2->col + 2;
    xVar6 = pxVar9[2];
    if (xVar6 == '\0') {
      xmlParserGrow(ctxt);
      pxVar2 = ctxt->input;
      pxVar5 = pxVar2->cur;
      xVar6 = *pxVar5;
    }
    if ((xVar6 == '-') && (pxVar5[1] == '-')) {
      pxVar2->cur = pxVar5 + 2;
      pxVar2->col = pxVar2->col + 2;
      if (pxVar5[2] == '\0') {
        xmlParserGrow(ctxt);
        pxVar2 = ctxt->input;
      }
      if (((pxVar2->flags & 0x40) == 0) && ((long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
        xmlParserGrow(ctxt);
        pxVar2 = ctxt->input;
      }
      pxVar9 = pxVar2->cur;
      xVar6 = *pxVar9;
      local_40 = 100;
      len = 0;
      pxVar5 = (xmlChar *)0x0;
      do {
        if (xVar6 == '\n') {
          iVar3 = pxVar2->line;
          pxVar10 = pxVar9;
          do {
            iVar3 = iVar3 + 1;
            pxVar2->line = iVar3;
            pxVar2->col = 1;
            pxVar9 = pxVar10 + 1;
            pxVar1 = pxVar10 + 1;
            pxVar10 = pxVar9;
          } while (*pxVar1 == '\n');
        }
        while( true ) {
          while( true ) {
            iVar3 = pxVar2->col;
            while( true ) {
              for (; (xVar6 = *pxVar9, '-' < (char)xVar6 ||
                     (xVar6 == '\t' || (byte)(xVar6 - 0x20) < 0xd)); pxVar9 = pxVar9 + 1) {
                iVar3 = iVar3 + 1;
              }
              pxVar2->col = iVar3;
              if (*pxVar9 != '\n') break;
              iVar3 = pxVar2->line;
              do {
                iVar3 = iVar3 + 1;
                pxVar2->line = iVar3;
                pxVar2->col = 1;
                pxVar10 = pxVar9 + 1;
                pxVar9 = pxVar9 + 1;
              } while (*pxVar10 == '\n');
              iVar3 = 1;
            }
            __n = (long)pxVar9 - (long)pxVar2->cur;
            if (__n != 0) {
              if (lVar7 - len < __n) {
                xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_COMMENT_NOT_FINISHED,
                           XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,
                           "Comment too big found",0);
                goto LAB_00136cb5;
              }
              if (pxVar5 == (xmlChar *)0x0) {
                if ((*pxVar9 != '-') || (lVar8 = 1, pxVar9[1] != '-')) {
                  lVar8 = 100;
                }
                local_40 = lVar8 + __n;
                pxVar10 = (xmlChar *)(*xmlMalloc)(local_40);
                if (pxVar10 == (xmlChar *)0x0) {
                  xmlCtxtErrMemory(ctxt);
                  return;
                }
                len = 0;
              }
              else {
                pxVar10 = pxVar5;
                if (local_40 <= __n + len + 1) {
                  local_40 = local_40 + __n + len + 100;
                  pxVar10 = (xmlChar *)(*xmlRealloc)(pxVar5,local_40);
                  if (pxVar10 == (xmlChar *)0x0) {
                    xmlCtxtErrMemory(ctxt);
                    goto LAB_00136cb5;
                  }
                }
              }
              memcpy(pxVar10 + len,ctxt->input->cur,__n);
              len = len + __n;
              pxVar10[len] = '\0';
              pxVar2 = ctxt->input;
              pxVar5 = pxVar10;
            }
            pxVar2->cur = pxVar9;
            xVar6 = *pxVar9;
            if (xVar6 == '\n') {
              pxVar2->line = pxVar2->line + 1;
              pxVar2->col = 1;
              xVar6 = pxVar9[1];
              pxVar9 = pxVar9 + 1;
            }
            if ((xVar6 != '\r') || (pxVar9[1] != '\n')) break;
            pxVar2->cur = pxVar9 + 1;
            pxVar9 = pxVar9 + 2;
            pxVar2->line = pxVar2->line + 1;
            pxVar2->col = 1;
          }
          uVar4 = pxVar2->flags;
          if ((uVar4 & 0x40) == 0) {
            xmlParserShrink(ctxt);
            pxVar2 = ctxt->input;
            uVar4 = pxVar2->flags;
          }
          if (((uVar4 & 0x40) == 0) && ((long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
            xmlParserGrow(ctxt);
            pxVar2 = ctxt->input;
          }
          pxVar9 = pxVar2->cur;
          xVar6 = *pxVar9;
          if (xVar6 != '-') break;
          if (pxVar9[1] == '-') {
            if (pxVar9[2] == '>') {
              pxVar2->cur = pxVar9 + 3;
              pxVar2->col = pxVar2->col + 3;
              if (pxVar9[3] == '\0') {
                xmlParserGrow(ctxt);
              }
              if (((ctxt->sax == (_xmlSAXHandler *)0x0) ||
                  (UNRECOVERED_JUMPTABLE = ctxt->sax->comment,
                  UNRECOVERED_JUMPTABLE == (commentSAXFunc)0x0)) || (ctxt->disableSAX != 0)) {
                if (pxVar5 == (xmlChar *)0x0) {
                  return;
                }
              }
              else {
                if (pxVar5 == (xmlChar *)0x0) {
                  (*UNRECOVERED_JUMPTABLE)(ctxt->userData,"");
                  return;
                }
                (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pxVar5);
              }
LAB_00136cb5:
              (*xmlFree)(pxVar5);
              return;
            }
            if (pxVar5 == (xmlChar *)0x0) {
              msg = "Double hyphen within comment\n";
              pxVar10 = (xmlChar *)0x0;
            }
            else {
              msg = "Double hyphen within comment: <!--%.50s\n";
              pxVar10 = pxVar5;
            }
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_HYPHEN_IN_COMMENT,XML_ERR_FATAL,
                       pxVar10,(xmlChar *)0x0,(xmlChar *)0x0,0,msg,pxVar10);
            pxVar9 = pxVar9 + 1;
            pxVar2 = ctxt->input;
            iVar3 = pxVar2->col + 1;
            pxVar2->col = iVar3;
          }
          else {
            iVar3 = pxVar2->col;
          }
          pxVar9 = pxVar9 + 1;
          pxVar2->col = iVar3 + 1;
        }
        if (1 < (byte)(xVar6 - 9) && (char)xVar6 < ' ') {
          xmlParseCommentComplex(ctxt,pxVar5,len,local_40);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void
xmlParseComment(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t len = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    const xmlChar *in;
    size_t nbchar = 0;
    int ccol;

    /*
     * Check that there is a comment right here.
     */
    if ((RAW != '<') || (NXT(1) != '!'))
        return;
    SKIP(2);
    if ((RAW != '-') || (NXT(1) != '-'))
        return;
    SKIP(2);
    GROW;

    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    in = ctxt->input->cur;
    do {
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	}
get_more:
        ccol = ctxt->input->col;
	while (((*in > '-') && (*in <= 0x7F)) ||
	       ((*in >= 0x20) && (*in < '-')) ||
	       (*in == 0x09)) {
		    in++;
		    ccol++;
	}
	ctxt->input->col = ccol;
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	    goto get_more;
	}
	nbchar = in - ctxt->input->cur;
	/*
	 * save current set of data
	 */
	if (nbchar > 0) {
            if (nbchar > maxLength - len) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                                  "Comment too big found", NULL);
                xmlFree(buf);
                return;
            }
            if (buf == NULL) {
                if ((*in == '-') && (in[1] == '-'))
                    size = nbchar + 1;
                else
                    size = XML_PARSER_BUFFER_SIZE + nbchar;
                buf = xmlMalloc(size);
                if (buf == NULL) {
                    xmlErrMemory(ctxt);
                    return;
                }
                len = 0;
            } else if (len + nbchar + 1 >= size) {
                xmlChar *new_buf;
                size += len + nbchar + XML_PARSER_BUFFER_SIZE;
                new_buf = xmlRealloc(buf, size);
                if (new_buf == NULL) {
                    xmlErrMemory(ctxt);
                    xmlFree(buf);
                    return;
                }
                buf = new_buf;
            }
            memcpy(&buf[len], ctxt->input->cur, nbchar);
            len += nbchar;
            buf[len] = 0;
	}
	ctxt->input->cur = in;
	if (*in == 0xA) {
	    in++;
	    ctxt->input->line++; ctxt->input->col = 1;
	}
	if (*in == 0xD) {
	    in++;
	    if (*in == 0xA) {
		ctxt->input->cur = in;
		in++;
		ctxt->input->line++; ctxt->input->col = 1;
		goto get_more;
	    }
	    in--;
	}
	SHRINK;
	GROW;
	in = ctxt->input->cur;
	if (*in == '-') {
	    if (in[1] == '-') {
	        if (in[2] == '>') {
		    SKIP(3);
		    if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
		        (!ctxt->disableSAX)) {
			if (buf != NULL)
			    ctxt->sax->comment(ctxt->userData, buf);
			else
			    ctxt->sax->comment(ctxt->userData, BAD_CAST "");
		    }
		    if (buf != NULL)
		        xmlFree(buf);
		    return;
		}
		if (buf != NULL) {
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment: "
                                      "<!--%.50s\n",
				      buf);
		} else
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment\n", NULL);
		in++;
		ctxt->input->col++;
	    }
	    in++;
	    ctxt->input->col++;
	    goto get_more;
	}
    } while (((*in >= 0x20) && (*in <= 0x7F)) || (*in == 0x09) || (*in == 0x0a));
    xmlParseCommentComplex(ctxt, buf, len, size);
}